

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_d581ab::HandleHasItemCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status,function<bool_(const_cmCMakePath_&)> *has_item)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  bool bVar1;
  allocator<char> local_81;
  cmCMakePath path;
  string inputPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  a = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)a != 0x60) {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[36]>
              ((string *)&path,a,(char (*) [36])0x73d52c);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&path);
    return false;
  }
  inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
  inputPath._M_string_length = 0;
  inputPath.field_2._M_local_buf[0] = '\0';
  bVar1 = getInputPath(a + 1,status,&inputPath);
  if (bVar1) {
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[2]._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_38,(string *)&inputPath);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&path,&local_38,generic_format);
      std::__cxx11::string::~string((string *)&local_38);
      bVar1 = std::function<bool_(const_cmCMakePath_&)>::operator()(has_item,&path);
      cmMakefile::AddDefinitionBool
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,bVar1);
      std::filesystem::__cxx11::path::~path(&path.Path);
      bVar1 = true;
      goto LAB_00326fcf;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"Invalid name for output variable.",&local_81);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&path);
  }
  bVar1 = false;
LAB_00326fcf:
  std::__cxx11::string::~string((string *)&inputPath);
  return bVar1;
}

Assistant:

bool HandleHasItemCommand(
  std::vector<std::string> const& args, cmExecutionStatus& status,
  const std::function<bool(const cmCMakePath&)>& has_item)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args.front(), " must be called with two arguments."));
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  if (args[2].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path(inputPath);
  auto result = has_item(path);

  status.GetMakefile().AddDefinitionBool(args[2], result);

  return true;
}